

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

void ws_dec_info(ws_decoder *dec,Curl_easy *data,char *msg)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  curl_trc_feat *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar2 = dec->head_len;
  if (uVar2 != 0) {
    if (uVar2 == 1) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        uVar1 = dec->head[0];
        pcVar5 = ws_frame_name_of_op(uVar1);
        pcVar6 = "";
        if (-1 < (char)uVar1) {
          pcVar6 = " NON-FINAL";
        }
        Curl_trc_write(data,"websocket, decoded %s [%s%s]",msg,pcVar5,pcVar6);
        return;
      }
    }
    else {
      iVar3 = dec->head_total;
      if ((int)uVar2 < iVar3) {
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          uVar1 = dec->head[0];
          pcVar5 = ws_frame_name_of_op(uVar1);
          pcVar6 = "";
          if (-1 < (char)uVar1) {
            pcVar6 = " NON-FINAL";
          }
          Curl_trc_write(data,"websocket, decoded %s [%s%s](%d/%d)",msg,pcVar5,pcVar6,(ulong)uVar2,
                         CONCAT44(uVar7,iVar3));
        }
      }
      else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) && (0 < Curl_trc_feat_write.log_level)) {
        uVar1 = dec->head[0];
        pcVar5 = ws_frame_name_of_op(uVar1);
        pcVar6 = "";
        if (-1 < (char)uVar1) {
          pcVar6 = " NON-FINAL";
        }
        Curl_trc_write(data,"websocket, decoded %s [%s%s payload=%ld/%ld]",msg,pcVar5,pcVar6,
                       dec->payload_offset,dec->payload_len);
      }
    }
  }
  return;
}

Assistant:

static void ws_dec_info(struct ws_decoder *dec, struct Curl_easy *data,
                        const char *msg)
{
  switch(dec->head_len) {
  case 0:
    break;
  case 1:
    CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s]", msg,
                   ws_frame_name_of_op(dec->head[0]),
                   (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL");
    break;
  default:
    if(dec->head_len < dec->head_total) {
      CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s](%d/%d)", msg,
                     ws_frame_name_of_op(dec->head[0]),
                     (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL",
                     dec->head_len, dec->head_total);
    }
    else {
      CURL_TRC_WRITE(data, "websocket, decoded %s [%s%s payload=%"
                     FMT_OFF_T "/%" FMT_OFF_T "]",
                     msg, ws_frame_name_of_op(dec->head[0]),
                     (dec->head[0] & WSBIT_FIN) ? "" : " NON-FINAL",
                     dec->payload_offset, dec->payload_len);
    }
    break;
  }
}